

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

size_t virtio_legacy_vring_size(uint num,unsigned_long align)

{
  size_t size;
  unsigned_long align_local;
  uint num_local;
  
  return (ulong)num * 8 + 4 +
         ((ulong)num * 2 + (ulong)num * 0x10 + align + 3 & (align - 1 ^ 0xffffffffffffffff));
}

Assistant:

static inline size_t virtio_legacy_vring_size(unsigned int num, unsigned long align) {
	size_t size;

	size = num * sizeof(struct vring_desc);
	size += sizeof(struct vring_avail) + (num * sizeof(uint16_t));
	size = RTE_ALIGN_CEIL(size, align);
	size += sizeof(struct vring_used) + (num * sizeof(struct vring_used_elem));
	return size;
}